

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O0

int __thiscall
ssllabs::SSLlabs::analyze
          (SSLlabs *this,string *domain,string *data,bool publish,bool startNew,bool fromCache,
          bool ignoreMismatch)

{
  allocator local_51;
  string local_50 [8];
  string command;
  bool ignoreMismatch_local;
  bool fromCache_local;
  bool startNew_local;
  bool publish_local;
  string *data_local;
  string *domain_local;
  SSLlabs *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"/analyze?host=",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::operator+=(local_50,(string *)domain);
  if ((startNew) && (fromCache)) {
    std::operator<<((ostream *)&std::cerr,"could not use startNew and fromCache at the same time\n")
    ;
    this_local._4_4_ = -1;
  }
  else {
    if (publish) {
      std::__cxx11::string::operator+=(local_50,"&publish=on");
    }
    if (startNew) {
      std::__cxx11::string::operator+=(local_50,"&startNew=on");
    }
    if (fromCache) {
      std::__cxx11::string::operator+=(local_50,"&fromCache=on");
    }
    else if (ignoreMismatch) {
      std::__cxx11::string::operator+=(local_50,"&ignoreMismatch=on");
    }
    this_local._4_4_ = curl_read(this,(string *)local_50,data);
  }
  std::__cxx11::string::~string(local_50);
  return this_local._4_4_;
}

Assistant:

int SSLlabs::analyze(const std::string domain, const std::string &data,
                         bool publish, bool startNew, bool fromCache, bool ignoreMismatch) {
        std::string command("/analyze?host=");

        command += domain;
        if (startNew && fromCache) {
            std::cerr << "could not use startNew and fromCache at the same time\n";
            return -1;
        }

        if (publish) {
            command += "&publish=on";
        }

        if (startNew) {
            command += "&startNew=on";
        }

        if (fromCache) {
            command += "&fromCache=on";
        }
        else {
            if (ignoreMismatch) {
                command += "&ignoreMismatch=on";
            }
        }

        return curl_read(command, data);
    }